

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Sector_SetFloorScale
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  FSectorTagIterator local_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  if (arg0 == 0) {
    local_50.start = 0;
  }
  else {
    local_50.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  local_50.searchtag = arg0;
  uVar1 = FSectorTagIterator::Next(&local_50);
  if (-1 < (int)uVar1) {
    auVar3._0_8_ = (double)arg4;
    auVar3._8_8_ = (double)arg2;
    auVar3 = divpd(auVar3,_DAT_00766d10);
    auVar4._0_8_ = auVar3._0_8_ + (double)arg3;
    auVar4._8_8_ = auVar3._8_8_ + (double)arg1;
    auVar3 = divpd(_DAT_00741530,auVar4);
    local_38 = (double)(~-(ulong)(auVar4._0_8_ != 0.0) & (ulong)auVar4._0_8_ |
                       auVar3._0_8_ & -(ulong)(auVar4._0_8_ != 0.0));
    local_48 = (double)(~-(ulong)(auVar4._8_8_ != 0.0) & (ulong)auVar4._8_8_ |
                       auVar3._8_8_ & -(ulong)(auVar4._8_8_ != 0.0));
    auVar5._8_8_ = -(ulong)(local_48 != 0.0);
    auVar5._0_8_ = -(ulong)(local_38 != 0.0);
    uVar2 = movmskpd(arg2,auVar5);
    dStack_40 = local_48;
    dStack_30 = local_48;
    do {
      if ((byte)((byte)uVar2 >> 1) != 0) {
        sectors[uVar1].planes[0].xform.xScale = local_48;
      }
      if ((uVar2 & 1) != 0) {
        sectors[uVar1].planes[0].xform.yScale = local_38;
      }
      uVar1 = FSectorTagIterator::Next(&local_50);
    } while (-1 < (int)uVar1);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetFloorScale)
// Sector_SetFloorScale (tag, x-int, x-frac, y-int, y-frac)
{
	double xscale = arg1 + arg2 / 100.;
	double yscale = arg3 + arg4 / 100.;

	if (xscale)
		xscale = 1. / xscale;
	if (yscale)
		yscale = 1. / yscale;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		if (xscale)
			sectors[secnum].SetXScale(sector_t::floor, xscale);
		if (yscale)
			sectors[secnum].SetYScale(sector_t::floor, yscale);
	}
	return true;
}